

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worker.c
# Opt level: O3

_Bool ecs_worker_sync(ecs_world_t *world)

{
  int iVar1;
  int32_t iVar2;
  
  iVar1 = (world->stats).pipeline_build_count_total;
  iVar2 = ecs_vector_count(world->workers);
  if (iVar2 == 0) {
    ecs_staging_end(world);
    ecs_pipeline_update(world,world->pipeline);
    ecs_staging_begin(world);
  }
  else {
    sync_worker(world);
  }
  return (world->stats).pipeline_build_count_total != iVar1;
}

Assistant:

bool ecs_worker_sync(
    ecs_world_t *world)
{
    int32_t build_count = world->stats.pipeline_build_count_total;

    int32_t thread_count = ecs_vector_count(world->workers);
    if (!thread_count) {
        ecs_staging_end(world);

        ecs_pipeline_update(world, world->pipeline);

        ecs_staging_begin(world);
    } else {
        sync_worker(world);
    }

    return world->stats.pipeline_build_count_total != build_count;
}